

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedBindingUpdate::Run(AdvancedBindingUpdate *this)

{
  CallLogWrapper *this_00;
  undefined8 *puVar1;
  GLsizei GVar2;
  bool bVar3;
  GLuint GVar4;
  GLint GVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 *puVar9;
  void *pvVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  GLuint i;
  long lVar11;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  undefined8 local_50;
  undefined4 local_48;
  char *glsl_fs;
  char *glsl_vs;
  
  glsl_vs = 
  "#version 430 core\nlayout(location = 0) in vec4 vs_in_position;\nlayout(location = 1) in vec2 vs_in_color_rg;\nlayout(location = 2) in float vs_in_color_b;\nlayout(location = 3) in dvec3 vs_in_data0;\nlayout(location = 4) in ivec2 vs_in_data1;\nout StageData {\n  vec2 color_rg;\n  float color_b;\n  dvec3 data0;\n  ivec2 data1;\n} vs_out;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nvoid main() {\n  vs_out.data1 = vs_in_data1;\n  vs_out.data0 = vs_in_data0;\n  vs_out.color_b = vs_in_color_b;\n  vs_out.color_rg = vs_in_color_rg;\n  gl_Position = vs_in_position;\n}"
  ;
  glsl_fs = 
  "#version 430 core\nin StageData {\n  vec2 color_rg;\n  float color_b;\n  flat dvec3 data0;\n  flat ivec2 data1;\n} fs_in;\nlayout(location = 0) out vec4 fs_out_color;\nuniform dvec3 g_expected_data0;\nuniform ivec2 g_expected_data1;\nvoid main() {\n  fs_out_color = vec4(fs_in.color_rg, fs_in.color_b, 1);\n  if (fs_in.data0 != g_expected_data0) fs_out_color = vec4(1);\n  if (fs_in.data1 != g_expected_data1) fs_out_color = vec4(1);\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar4 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&glsl_vs);
  this->m_vsp = GVar4;
  GVar4 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,1,&glsl_fs);
  this->m_fsp = GVar4;
  bVar3 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_vsp);
  lVar11 = -1;
  if (bVar3) {
    bVar3 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_fsp);
    if (bVar3) {
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,2,this->m_fsp);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
      lVar11 = 0;
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0xd0,(void *)0x0,0x88e4);
      puVar9 = (undefined8 *)glu::CallLogWrapper::glMapBuffer(this_00,0x8892,0x88b9);
      *puVar9 = 0xbf800000bf800000;
      *(undefined8 *)((long)puVar9 + 0x34) = 0xbf8000003f800000;
      puVar9[0xd] = 0x3f8000003f800000;
      *(undefined8 *)((long)puVar9 + 0x9c) = 0x3f800000bf800000;
      do {
        *(undefined8 *)((long)puVar9 + lVar11 + 8) = 0x3f80000000000000;
        *(undefined4 *)((long)puVar9 + lVar11 + 0x10) = 0;
        puVar1 = (undefined8 *)((long)puVar9 + lVar11 + 0x14);
        *puVar1 = 0x3ff0000000000000;
        puVar1[1] = 0x4000000000000000;
        *(undefined8 *)((long)puVar9 + lVar11 + 0x24) = 0x4008000000000000;
        *(undefined8 *)((long)puVar9 + lVar11 + 0x2c) = 0x200000001;
        lVar11 = lVar11 + 0x34;
      } while (lVar11 != 0xd0);
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
      lVar11 = 0;
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x100,(void *)0x0,0x88e4);
      pvVar10 = glu::CallLogWrapper::glMapBuffer(this_00,0x8892,0x88b9);
      *(undefined8 *)((long)pvVar10 + 8) = 0x3f800000bf800000;
      *(undefined8 *)((long)pvVar10 + 0x46) = 0x3f8000003f800000;
      *(undefined8 *)((long)pvVar10 + 0x84) = 0xbf8000003f800000;
      *(undefined8 *)((long)pvVar10 + 0xc2) = 0xbf800000bf800000;
      do {
        *(undefined8 *)((long)pvVar10 + lVar11 + 0x10) = 0;
        *(undefined4 *)((long)pvVar10 + lVar11 + 0x18) = 0x3f800000;
        puVar9 = (undefined8 *)((long)pvVar10 + lVar11 + 0x1c);
        *puVar9 = 0x4010000000000000;
        puVar9[1] = 0x4014000000000000;
        *(undefined8 *)((long)pvVar10 + lVar11 + 0x2c) = 0x4018000000000000;
        *(undefined8 *)((long)pvVar10 + lVar11 + 0x34) = 0x400000003;
        lVar11 = lVar11 + 0x3e;
      } while (lVar11 != 0xf8);
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
      GVar4 = 0;
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[0]);
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x2000300010000;
      glu::CallLogWrapper::glBufferData(this_00,0x8893,8,&fb,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[1]);
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x200000003;
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x100000000;
      glu::CallLogWrapper::glBufferData(this_00,0x8893,0x10,&fb,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,0);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,1,2,0x1406,'\0',8);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,2,1,0x1406,'\0',0x10);
      glu::CallLogWrapper::glVertexAttribLFormat(this_00,3,3,0x140a,0x14);
      glu::CallLogWrapper::glVertexAttribIFormat(this_00,4,2,0x1404,0x2c);
      do {
        glu::CallLogWrapper::glVertexAttribBinding(this_00,GVar4,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,GVar4);
        GVar4 = GVar4 + 1;
      } while (GVar4 != 5);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,1,2,0x1406,'\0',8);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,2,1,0x1406,'\0',0x10);
      glu::CallLogWrapper::glVertexAttribLFormat(this_00,3,3,0x140a,0x14);
      glu::CallLogWrapper::glVertexAttribIFormat(this_00,4,2,0x1404,0x2c);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,0,1);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,1,8);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,2,1);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,3,1);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,4,8);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,3);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_vbo[1],8,0x3e);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,8,this->m_vbo[0],0,0x34);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[1]);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_ppo);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
      GVar4 = this->m_fsp;
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data0");
      glu::CallLogWrapper::glProgramUniform3d(this_00,GVar4,GVar5,1.0,2.0,3.0);
      GVar4 = this->m_fsp;
      GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data1");
      glu::CallLogWrapper::glProgramUniform2i(this_00,GVar4,GVar5,1,2);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[0],0,0x34);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[0]);
      glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                (this_00,5,4,0x1403,(void *)0x0,1,0,0);
      iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      iVar6 = *(int *)CONCAT44(extraout_var,iVar6);
      iVar7 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
                (&fb,(long)(iVar6 * *(int *)(CONCAT44(extraout_var_00,iVar7) + 4)),
                 (allocator_type *)&local_50);
      iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      GVar2 = *(GLsizei *)CONCAT44(extraout_var_01,iVar6);
      iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      glu::CallLogWrapper::glReadPixels
                (this_00,0,0,GVar2,*(GLsizei *)(CONCAT44(extraout_var_02,iVar6) + 4),0x1907,0x1406,
                 fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      iVar6 = *(int *)CONCAT44(extraout_var_03,iVar6);
      iVar7 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      iVar7 = *(int *)CONCAT44(extraout_var_04,iVar7);
      iVar8 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      local_50 = 0x3f80000000000000;
      local_48 = 0;
      bVar3 = VertexAttribBindingBase::CheckRectColor
                        ((VertexAttribBindingBase *)
                         ((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                         m_context)->m_renderCtx,&fb,iVar6,iVar7,
                         *(int *)(CONCAT44(extraout_var_05,iVar8) + 4),(int)&local_50,
                         (int)fb.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                         fb.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      lVar11 = -1;
      if (bVar3) {
        GVar4 = this->m_fsp;
        GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data0");
        glu::CallLogWrapper::glProgramUniform3d(this_00,GVar4,GVar5,4.0,5.0,6.0);
        GVar4 = this->m_fsp;
        GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data1");
        glu::CallLogWrapper::glProgramUniform2i(this_00,GVar4,GVar5,3,4);
        glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[1],8,0x3e);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[1]);
        glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                  (this_00,5,4,0x1405,(void *)0x0,1,0,0);
        iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        GVar2 = *(GLsizei *)CONCAT44(extraout_var_06,iVar6);
        iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        glu::CallLogWrapper::glReadPixels
                  (this_00,0,0,GVar2,*(GLsizei *)(CONCAT44(extraout_var_07,iVar6) + 4),0x1907,0x1406
                   ,fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        iVar6 = *(int *)CONCAT44(extraout_var_08,iVar6);
        iVar7 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        iVar7 = *(int *)CONCAT44(extraout_var_09,iVar7);
        iVar8 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        local_50 = 0;
        local_48 = 0x3f800000;
        bVar3 = VertexAttribBindingBase::CheckRectColor
                          ((VertexAttribBindingBase *)
                           ((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                           m_context)->m_renderCtx,&fb,iVar6,iVar7,
                           *(int *)(CONCAT44(extraout_var_10,iVar8) + 4),(int)&local_50,
                           (int)fb.
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                           fb.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if (bVar3) {
          glu::CallLogWrapper::glBindVertexBuffer(this_00,0,0,0,0);
          GVar4 = this->m_fsp;
          GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data0");
          glu::CallLogWrapper::glProgramUniform3d(this_00,GVar4,GVar5,1.0,2.0,3.0);
          GVar4 = this->m_fsp;
          GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data1");
          glu::CallLogWrapper::glProgramUniform2i(this_00,GVar4,GVar5,1,2);
          GVar4 = 0;
          do {
            glu::CallLogWrapper::glVertexAttribBinding(this_00,GVar4,0xf);
            GVar4 = GVar4 + 1;
          } while (GVar4 != 5);
          glu::CallLogWrapper::glBindVertexBuffer(this_00,0xf,this->m_vbo[0],0,0x34);
          glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[0]);
          glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                    (this_00,5,4,0x1403,(void *)0x0,1,0,0);
          iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          GVar2 = *(GLsizei *)CONCAT44(extraout_var_11,iVar6);
          iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          glu::CallLogWrapper::glReadPixels
                    (this_00,0,0,GVar2,*(GLsizei *)(CONCAT44(extraout_var_12,iVar6) + 4),0x1907,
                     0x1406,fb.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          iVar6 = *(int *)CONCAT44(extraout_var_13,iVar6);
          iVar7 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          iVar7 = *(int *)CONCAT44(extraout_var_14,iVar7);
          iVar8 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          local_50 = 0x3f80000000000000;
          local_48 = 0;
          bVar3 = VertexAttribBindingBase::CheckRectColor
                            ((VertexAttribBindingBase *)
                             ((this->super_VertexAttribBindingBase).super_SubcaseBase.
                              super_GLWrapper.m_context)->m_renderCtx,&fb,iVar6,iVar7,
                             *(int *)(CONCAT44(extraout_var_15,iVar8) + 4),(int)&local_50,
                             (int)fb.
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                             fb.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          if (bVar3) {
            glu::CallLogWrapper::glBindVertexBuffer(this_00,0xf,0,0,0);
            GVar4 = this->m_fsp;
            GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data0");
            glu::CallLogWrapper::glProgramUniform3d(this_00,GVar4,GVar5,1.0,2.0,3.0);
            GVar4 = this->m_fsp;
            GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data1");
            glu::CallLogWrapper::glProgramUniform2i(this_00,GVar4,GVar5,3,4);
            glu::CallLogWrapper::glBindVertexBuffer(this_00,7,this->m_vbo[0],0,0x34);
            glu::CallLogWrapper::glBindVertexBuffer(this_00,0xc,this->m_vbo[1],8,0x3e);
            glu::CallLogWrapper::glVertexAttribBinding(this_00,0,7);
            glu::CallLogWrapper::glVertexAttribBinding(this_00,1,0xc);
            glu::CallLogWrapper::glVertexAttribBinding(this_00,2,0xc);
            glu::CallLogWrapper::glVertexAttribBinding(this_00,3,7);
            glu::CallLogWrapper::glVertexAttribBinding(this_00,4,0xc);
            glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_ebo[0]);
            glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                      (this_00,5,4,0x1403,(void *)0x0,1,0,0);
            iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            GVar2 = *(GLsizei *)CONCAT44(extraout_var_16,iVar6);
            iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            glu::CallLogWrapper::glReadPixels
                      (this_00,0,0,GVar2,*(GLsizei *)(CONCAT44(extraout_var_17,iVar6) + 4),0x1907,
                       0x1406,fb.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar6 = *(int *)CONCAT44(extraout_var_18,iVar6);
            iVar7 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar7 = *(int *)CONCAT44(extraout_var_19,iVar7);
            iVar8 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            local_50 = 0;
            local_48 = 0x3f800000;
            bVar3 = VertexAttribBindingBase::CheckRectColor
                              ((VertexAttribBindingBase *)
                               ((this->super_VertexAttribBindingBase).super_SubcaseBase.
                                super_GLWrapper.m_context)->m_renderCtx,&fb,iVar6,iVar7,
                               *(int *)(CONCAT44(extraout_var_20,iVar8) + 4),(int)&local_50,
                               (int)fb.
                                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                               fb.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
            if (bVar3) {
              glu::CallLogWrapper::glClear(this_00,0x4000);
              GVar4 = this->m_fsp;
              GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data1");
              glu::CallLogWrapper::glProgramUniform2i(this_00,GVar4,GVar5,0,0);
              glu::CallLogWrapper::glDisableVertexAttribArray(this_00,4);
              glu::CallLogWrapper::glVertexAttribI4i(this_00,4,0,0,0,0);
              glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                        (this_00,5,4,0x1403,(void *)0x0,1,0,0);
              iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              GVar2 = *(GLsizei *)CONCAT44(extraout_var_21,iVar6);
              iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              glu::CallLogWrapper::glReadPixels
                        (this_00,0,0,GVar2,*(GLsizei *)(CONCAT44(extraout_var_22,iVar6) + 4),0x1907,
                         0x1406,fb.
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              iVar6 = *(int *)CONCAT44(extraout_var_23,iVar6);
              iVar7 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              iVar7 = *(int *)CONCAT44(extraout_var_24,iVar7);
              iVar8 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              local_50 = 0;
              local_48 = 0x3f800000;
              bVar3 = VertexAttribBindingBase::CheckRectColor
                                ((VertexAttribBindingBase *)
                                 ((this->super_VertexAttribBindingBase).super_SubcaseBase.
                                  super_GLWrapper.m_context)->m_renderCtx,&fb,iVar6,iVar7,
                                 *(int *)(CONCAT44(extraout_var_25,iVar8) + 4),(int)&local_50,
                                 (int)fb.
                                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                 fb.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
              if (bVar3) {
                GVar4 = this->m_fsp;
                GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data0");
                glu::CallLogWrapper::glProgramUniform3d(this_00,GVar4,GVar5,4.0,5.0,6.0);
                GVar4 = this->m_fsp;
                GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar4,"g_expected_data1");
                glu::CallLogWrapper::glProgramUniform2i(this_00,GVar4,GVar5,1,2);
                glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
                glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                          (this_00,5,4,0x1405,(void *)0x0,1,0,0);
                iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                GVar2 = *(GLsizei *)CONCAT44(extraout_var_26,iVar6);
                iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                glu::CallLogWrapper::glReadPixels
                          (this_00,0,0,GVar2,*(GLsizei *)(CONCAT44(extraout_var_27,iVar6) + 4),
                           0x1907,0x1406,
                           fb.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                iVar6 = *(int *)CONCAT44(extraout_var_28,iVar6);
                iVar7 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                iVar7 = *(int *)CONCAT44(extraout_var_29,iVar7);
                iVar8 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                local_50 = 0x3f80000000000000;
                local_48 = 0x3f800000;
                bVar3 = VertexAttribBindingBase::CheckRectColor
                                  ((VertexAttribBindingBase *)
                                   ((this->super_VertexAttribBindingBase).super_SubcaseBase.
                                    super_GLWrapper.m_context)->m_renderCtx,&fb,iVar6,iVar7,
                                   *(int *)(CONCAT44(extraout_var_30,iVar8) + 4),(int)&local_50,
                                   (int)fb.
                                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                   fb.
                                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
                lVar11 = (ulong)bVar3 - 1;
              }
            }
          }
        }
      }
      if (fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(fb.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)fb.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)fb.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return lVar11;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "layout(location = 0) in vec4 vs_in_position;" NL
			"layout(location = 1) in vec2 vs_in_color_rg;" NL "layout(location = 2) in float vs_in_color_b;" NL
			"layout(location = 3) in dvec3 vs_in_data0;" NL "layout(location = 4) in ivec2 vs_in_data1;" NL
			"out StageData {" NL "  vec2 color_rg;" NL "  float color_b;" NL "  dvec3 data0;" NL "  ivec2 data1;" NL
			"} vs_out;" NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "void main() {" NL
			"  vs_out.data1 = vs_in_data1;" NL "  vs_out.data0 = vs_in_data0;" NL "  vs_out.color_b = vs_in_color_b;" NL
			"  vs_out.color_rg = vs_in_color_rg;" NL "  gl_Position = vs_in_position;" NL "}";
		const char* const glsl_fs = "#version 430 core" NL "in StageData {" NL "  vec2 color_rg;" NL
									"  float color_b;" NL "  flat dvec3 data0;" NL "  flat ivec2 data1;" NL
									"} fs_in;" NL "layout(location = 0) out vec4 fs_out_color;" NL
									"uniform dvec3 g_expected_data0;" NL "uniform ivec2 g_expected_data1;" NL
									"void main() {" NL "  fs_out_color = vec4(fs_in.color_rg, fs_in.color_b, 1);" NL
									"  if (fs_in.data0 != g_expected_data0) fs_out_color = vec4(1);" NL
									"  if (fs_in.data1 != g_expected_data1) fs_out_color = vec4(1);" NL "}";
		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
			return ERROR;

		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);

		const GLsizei  kStride[2] = { 52, 62 };
		const GLintptr kOffset[2] = { 0, 8 };
		/* Workaround for alignment issue that may result in bus error on some platforms */
		union {
			double d[3];
			char   c[3 * sizeof(double)];
		} u;

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		{
			glBufferData(GL_ARRAY_BUFFER, kOffset[0] + 4 * kStride[0], NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY));

			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 0 * kStride[0]]) = Vec2(-1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 1 * kStride[0]]) = Vec2(1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 2 * kStride[0]]) = Vec2(1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 3 * kStride[0]]) = Vec2(-1.0f, 1.0f);

			for (int i = 0; i < 4; ++i)
			{
				*reinterpret_cast<Vec2*>(&ptr[kOffset[0] + 8 + i * kStride[0]])   = Vec2(0.0f, 1.0f);
				*reinterpret_cast<float*>(&ptr[kOffset[0] + 16 + i * kStride[0]]) = 0.0f;
				//*reinterpret_cast<DVec3 *>(&ptr[kOffset[0] + 20 + i * kStride[0]]) = DVec3(1.0, 2.0, 3.0);

				memcpy(u.d, DVec3(1.0, 2.0, 3.0).m_data, 3 * sizeof(double));
				memcpy(&ptr[kOffset[0] + 20 + i * kStride[0]], u.c, 3 * sizeof(double));
				*reinterpret_cast<IVec2*>(&ptr[kOffset[0] + 44 + i * kStride[0]]) = IVec2(1, 2);
			}
			glUnmapBuffer(GL_ARRAY_BUFFER);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		{
			glBufferData(GL_ARRAY_BUFFER, kOffset[1] + 4 * kStride[1], NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY));

			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 0 * kStride[1]]) = Vec2(-1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 1 * kStride[1]]) = Vec2(1.0f, 1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 2 * kStride[1]]) = Vec2(1.0f, -1.0f);
			*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 3 * kStride[1]]) = Vec2(-1.0f, -1.0f);

			for (int i = 0; i < 4; ++i)
			{
				*reinterpret_cast<Vec2*>(&ptr[kOffset[1] + 8 + i * kStride[1]])   = Vec2(0.0f, 0.0f);
				*reinterpret_cast<float*>(&ptr[kOffset[1] + 16 + i * kStride[1]]) = 1.0f;
				//*reinterpret_cast<DVec3 *>(&ptr[kOffset[1] + 20 + i * kStride[1]]) = DVec3(4.0, 5.0, 6.0);

				memcpy(u.d, DVec3(4.0, 5.0, 6.0).m_data, 3 * sizeof(double));
				memcpy(&ptr[kOffset[1] + 20 + i * kStride[1]], u.c, 3 * sizeof(double));
				*reinterpret_cast<IVec2*>(&ptr[kOffset[1] + 44 + i * kStride[1]]) = IVec2(3, 4);
			}
			glUnmapBuffer(GL_ARRAY_BUFFER);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		{
			GLushort data[4] = { 0, 1, 3, 2 };
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		{
			GLuint data[4] = { 3, 2, 0, 1 };
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao[0]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribLFormat(3, 3, GL_DOUBLE, 20);
		glVertexAttribIFormat(4, 2, GL_INT, 44);

		for (GLuint i = 0; i < 5; ++i)
		{
			glVertexAttribBinding(i, 0);
			glEnableVertexAttribArray(i);
		}
		glBindVertexArray(m_vao[1]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 2, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribFormat(2, 1, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribLFormat(3, 3, GL_DOUBLE, 20);
		glVertexAttribIFormat(4, 2, GL_INT, 44);
		glVertexAttribBinding(0, 1);
		glVertexAttribBinding(1, 8);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(3, 1);
		glVertexAttribBinding(4, 8);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(3);
		glEnableVertexAttribArray(4);
		glBindVertexBuffer(1, m_vbo[1], kOffset[1], kStride[1]);
		glBindVertexBuffer(8, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao[0]);

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 1.0, 2.0, 3.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 1, 2);

		glBindVertexBuffer(0, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0, 0);

		bool			  status = true;
		std::vector<Vec3> fb(getWindowWidth() * getWindowHeight());
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 4.0, 5.0, 6.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 3, 4);

		glBindVertexBuffer(0, m_vbo[1], kOffset[1], kStride[1]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[1]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glBindVertexBuffer(0, 0, 0, 0);

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 1.0, 2.0, 3.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 1, 2);

		for (GLuint i = 0; i < 5; ++i)
			glVertexAttribBinding(i, 15);
		glBindVertexBuffer(15, m_vbo[0], kOffset[0], kStride[0]);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glBindVertexBuffer(15, 0, 0, 0);

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 1.0, 2.0, 3.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 3, 4);

		glBindVertexBuffer(7, m_vbo[0], kOffset[0], kStride[0]);
		glBindVertexBuffer(12, m_vbo[1], kOffset[1], kStride[1]);
		glVertexAttribBinding(0, 7);
		glVertexAttribBinding(1, 12);
		glVertexAttribBinding(2, 12);
		glVertexAttribBinding(3, 7);
		glVertexAttribBinding(4, 12);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_ebo[0]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glClear(GL_COLOR_BUFFER_BIT);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 0, 0);
		glDisableVertexAttribArray(4);
		glVertexAttribI4i(4, 0, 0, 0, 0);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_SHORT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glProgramUniform3d(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data0"), 4.0, 5.0, 6.0);
		glProgramUniform2i(m_fsp, glGetUniformLocation(m_fsp, "g_expected_data1"), 1, 2);

		glBindVertexArray(m_vao[1]);
		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1, 0, 0);

		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0.0f, 1.0f, 1.0f)))
			status = false;
		if (!status)
			return ERROR;

		return NO_ERROR;
	}